

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O1

bool __thiscall
MockQuicTransport::ReadHeader
          (MockQuicTransport *this,uint8_t *out_type,ssl_encryption_level_t *out_level,
          size_t *out_len)

{
  _Head_base<0UL,_bio_st_*,_false> _Var1;
  pointer pEVar2;
  void *__s2;
  bool bVar3;
  byte bVar4;
  byte in_AL;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint8_t *buf;
  uint8_t *data;
  pointer puVar11;
  uint8_t level_id;
  uint32_t remaining_bytes;
  uint16_t cipher_suite;
  vector<unsigned_char,_std::allocator<unsigned_char>_> read_secret;
  uint8_t header [8];
  CBS cbs;
  allocator_type local_8a;
  byte local_89;
  uint local_88;
  ushort local_82;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  MockQuicTransport *local_68;
  uint8_t *local_60;
  ssl_encryption_level_t *local_58;
  ulong *local_50;
  uint8_t local_48 [8];
  CBS local_40;
  
  local_68 = this;
  local_60 = out_type;
  local_58 = out_level;
  local_50 = out_len;
  do {
    _Var1._M_head_impl =
         (local_68->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
    data = local_48;
    uVar10 = 8;
    do {
      uVar7 = uVar10;
      if (uVar7 == 0) goto LAB_00123742;
      uVar10 = 0x7fffffff;
      if (uVar7 < 0x7fffffff) {
        uVar10 = uVar7;
      }
      uVar5 = BIO_read((BIO *)_Var1._M_head_impl,data,(int)uVar10);
      uVar10 = 0;
      if (0 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      data = data + uVar10;
      uVar10 = uVar7 - uVar10;
    } while (0 < (int)uVar5);
    if (uVar7 == 0) {
LAB_00123742:
      local_40.data = local_48;
      local_40.len = 8;
      iVar6 = CBS_get_u8(&local_40,out_type);
      if ((((iVar6 == 0) || (iVar6 = CBS_get_u8(&local_40,&local_89), iVar6 == 0)) ||
          (iVar6 = CBS_get_u16(&local_40,&local_82), iVar6 == 0)) ||
         (iVar6 = CBS_get_u32(&local_40,&local_88), bVar4 = local_89, iVar6 == 0)) {
LAB_00123979:
        ReadHeader();
        goto LAB_0012397e;
      }
      pEVar2 = (local_68->read_levels_).
               super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_68->read_levels_).
                        super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 5) <=
          (ulong)local_89) goto LAB_00123979;
      uVar10 = (ulong)local_89;
      uVar5 = (uint)local_89;
      if (local_89 == 0 || pEVar2[uVar10].cipher != 0) {
        if (local_82 == pEVar2[uVar10].cipher) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_80,
                     (long)*(pointer *)
                            ((long)&pEVar2[uVar10].secret.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl + 8) -
                     *(long *)&pEVar2[uVar10].secret.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data,&local_8a);
          uVar7 = (long)*(pointer *)
                         ((long)&pEVar2[uVar10].secret.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl + 8) -
                  *(long *)&pEVar2[uVar10].secret.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data;
          if (local_88 < uVar7) {
            ReadHeader((MockQuicTransport *)(ulong)uVar5);
            in_AL = 0;
          }
          else {
            local_88 = local_88 - (int)uVar7;
            _Var1._M_head_impl =
                 (local_68->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
            uVar7 = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            puVar11 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              uVar8 = uVar7;
              if (uVar8 == 0) goto LAB_00123911;
              uVar7 = 0x7fffffff;
              if (uVar8 < 0x7fffffff) {
                uVar7 = uVar8;
              }
              uVar5 = BIO_read((BIO *)_Var1._M_head_impl,puVar11,(int)uVar7);
              uVar7 = 0;
              if (0 < (int)uVar5) {
                uVar7 = (ulong)uVar5;
              }
              puVar11 = puVar11 + uVar7;
              uVar7 = uVar8 - uVar7;
            } while (0 < (int)uVar5);
            if (uVar8 == 0) {
LAB_00123911:
              __s2 = pEVar2[uVar10].secret.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
              if (((long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start ==
                   (long)*(pointer *)
                          ((long)&pEVar2[uVar10].secret.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl + 8) - (long)__s2) &&
                 ((local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish ==
                   local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start ||
                  (iVar6 = bcmp(local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,__s2,
                                (long)local_80.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_80.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start), iVar6 == 0)))) {
                *local_58 = (uint)bVar4;
                *local_50 = (ulong)local_88;
                in_AL = 1;
                out_type = local_60;
                goto LAB_0012395d;
              }
              ReadHeader((MockQuicTransport *)(ulong)(uint)bVar4);
            }
            else {
              ReadHeader();
            }
            in_AL = 0;
            out_type = local_60;
          }
LAB_0012395d:
          if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pcVar9 = "";
          if (local_89 < 4) {
            pcVar9 = *(char **)(&DAT_002d2fe0 + (ulong)local_89 * 8);
          }
          in_AL = 0;
          fprintf(_stderr,"Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",(ulong)local_82,
                  pcVar9);
        }
        bVar3 = true;
      }
      else {
        if (uVar5 != 1) {
          ReadHeader((MockQuicTransport *)(ulong)uVar5);
          goto LAB_0012397e;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_80,(ulong)local_88,&local_8a);
        _Var1._M_head_impl =
             (local_68->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
        uVar10 = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        puVar11 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
        do {
          bVar3 = uVar10 != 0;
          if (uVar10 == 0) goto LAB_00123859;
          uVar7 = 0x7fffffff;
          if (uVar10 < 0x7fffffff) {
            uVar7 = uVar10;
          }
          uVar5 = BIO_read((BIO *)_Var1._M_head_impl,puVar11,(int)uVar7);
          uVar7 = 0;
          if (0 < (int)uVar5) {
            uVar7 = (ulong)uVar5;
          }
          uVar10 = uVar10 - uVar7;
          puVar11 = puVar11 + uVar7;
        } while (0 < (int)uVar5);
        in_AL = 0;
LAB_00123859:
        if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
    else {
LAB_0012397e:
      bVar3 = true;
      in_AL = 0;
    }
    if (bVar3) {
      return (bool)(in_AL & 1);
    }
  } while( true );
}

Assistant:

bool MockQuicTransport::ReadHeader(uint8_t *out_type,
                                   enum ssl_encryption_level_t *out_level,
                                   size_t *out_len) {
  for (;;) {
    uint8_t header[8];
    if (!ReadAll(bio_.get(), header)) {
      // TODO(davidben): Distinguish between errors and EOF. See
      // ReadApplicationData.
      return false;
    }

    CBS cbs;
    uint8_t level_id;
    uint16_t cipher_suite;
    uint32_t remaining_bytes;
    CBS_init(&cbs, header, sizeof(header));
    if (!CBS_get_u8(&cbs, out_type) ||
        !CBS_get_u8(&cbs, &level_id) ||
        !CBS_get_u16(&cbs, &cipher_suite) ||
        !CBS_get_u32(&cbs, &remaining_bytes) ||
        level_id >= read_levels_.size()) {
      fprintf(stderr, "Error parsing record header.\n");
      return false;
    }

    auto level = static_cast<ssl_encryption_level_t>(level_id);
    // Non-initial levels must be configured before use.
    uint16_t expect_cipher = read_levels_[level].cipher;
    if (expect_cipher == 0 && level != ssl_encryption_initial) {
      if (level == ssl_encryption_early_data) {
        // If we receive early data records without any early data keys, skip
        // the record. This means early data was rejected.
        std::vector<uint8_t> discard(remaining_bytes);
        if (!ReadAll(bio_.get(), bssl::Span(discard))) {
          return false;
        }
        continue;
      }
      fprintf(stderr,
              "Got record at level %s, but keys were not configured.\n",
              LevelToString(level));
      return false;
    }
    if (cipher_suite != expect_cipher) {
      fprintf(stderr, "Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",
              cipher_suite, LevelToString(level), expect_cipher);
      return false;
    }
    const std::vector<uint8_t> &secret = read_levels_[level].secret;
    std::vector<uint8_t> read_secret(secret.size());
    if (remaining_bytes < secret.size()) {
      fprintf(stderr, "Record at level %s too small.\n", LevelToString(level));
      return false;
    }
    remaining_bytes -= secret.size();
    if (!ReadAll(bio_.get(), bssl::Span(read_secret))) {
      fprintf(stderr, "Error reading record secret.\n");
      return false;
    }
    if (read_secret != secret) {
      fprintf(stderr, "Encryption secret at level %s did not match.\n",
              LevelToString(level));
      return false;
    }
    *out_level = level;
    *out_len = remaining_bytes;
    return true;
  }
}